

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  int iVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  byte bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  ulong *puVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  Geometry *pGVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  float fVar30;
  undefined1 auVar35 [16];
  float fVar61;
  float fVar62;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar63;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar90;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  undefined1 local_bc9;
  ulong *local_bc8;
  size_t local_bc0;
  RayK<4> *local_bb8;
  ulong local_bb0;
  Geometry *local_ba8;
  ulong local_ba0;
  uint local_b94;
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  long local_b58;
  long local_b50;
  ulong local_b48;
  ulong local_b40;
  long local_b38;
  ulong *local_b30;
  ulong local_b28;
  ulong local_b20;
  ulong local_b18;
  ulong local_b10;
  ulong local_b08;
  ulong local_b00;
  ulong local_af8;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  undefined1 local_aa0 [16];
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [16];
  undefined4 local_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  uint local_960;
  uint uStack_95c;
  uint uStack_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  uint uStack_948;
  uint uStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 *local_8e0;
  char local_8d8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  uint uStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar97 = ZEXT1664(auVar31);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar98 = ZEXT1664(auVar31);
  auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar99 = ZEXT1664(auVar31);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar30 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar61 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar87 * 0.99999964)));
  auVar100 = ZEXT1664(auVar31);
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar30 * 0.99999964)));
  auVar101 = ZEXT1664(auVar31);
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar61 * 0.99999964)));
  auVar102 = ZEXT1664(auVar31);
  fVar87 = fVar87 * 1.0000004;
  fVar30 = fVar30 * 1.0000004;
  fVar61 = fVar61 * 1.0000004;
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar27 = uVar24 ^ 0x10;
  uVar29 = uVar25 ^ 0x10;
  iVar1 = (tray->tnear).field_0.i[k];
  local_a10._4_4_ = iVar1;
  local_a10._0_4_ = iVar1;
  local_a10._8_4_ = iVar1;
  local_a10._12_4_ = iVar1;
  auVar95 = ZEXT1664(local_a10);
  iVar1 = (tray->tfar).field_0.i[k];
  local_a20._4_4_ = iVar1;
  local_a20._0_4_ = iVar1;
  local_a20._8_4_ = iVar1;
  local_a20._12_4_ = iVar1;
  auVar96 = ZEXT1664(local_a20);
  local_b00 = uVar24 >> 2;
  local_b08 = uVar27 >> 2;
  local_b10 = uVar25 >> 2;
  local_b18 = uVar29 >> 2;
  local_b20 = uVar18 >> 2;
  local_b28 = (uVar18 ^ 0x10) >> 2;
  local_a30 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar15 = local_7f8;
  fVar62 = fVar87;
  fVar63 = fVar87;
  fVar64 = fVar87;
  fVar65 = fVar30;
  fVar66 = fVar30;
  fVar90 = fVar30;
  fVar91 = fVar61;
  fVar92 = fVar61;
  fVar93 = fVar61;
  local_bc0 = k;
  local_bb8 = ray;
  local_b48 = uVar25;
  local_b40 = uVar24;
  local_a00 = fVar61;
  fStack_9fc = fVar61;
  fStack_9f8 = fVar61;
  fStack_9f4 = fVar61;
  local_9f0 = fVar30;
  fStack_9ec = fVar30;
  fStack_9e8 = fVar30;
  fStack_9e4 = fVar30;
  local_9e0 = fVar87;
  fStack_9dc = fVar87;
  fStack_9d8 = fVar87;
  fStack_9d4 = fVar87;
LAB_01cf818a:
  do {
    local_b30 = puVar15;
    if (local_b30 == &local_800) {
LAB_01cf8e1a:
      return local_b30 != &local_800;
    }
    local_bc8 = local_b30 + -1;
    uVar28 = local_b30[-1];
    while ((uVar28 & 8) == 0) {
      auVar31 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar24),auVar97._0_16_);
      auVar31 = vmulps_avx512vl(auVar100._0_16_,auVar31);
      auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar25),auVar98._0_16_);
      auVar32 = vmulps_avx512vl(auVar101._0_16_,auVar32);
      auVar31 = vmaxps_avx(auVar31,auVar32);
      auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar18),auVar99._0_16_);
      auVar32 = vmulps_avx512vl(auVar102._0_16_,auVar32);
      auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar27),auVar97._0_16_);
      auVar34._0_4_ = fVar87 * auVar33._0_4_;
      auVar34._4_4_ = fVar62 * auVar33._4_4_;
      auVar34._8_4_ = fVar63 * auVar33._8_4_;
      auVar34._12_4_ = fVar64 * auVar33._12_4_;
      auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + uVar29),auVar98._0_16_);
      auVar74._0_4_ = fVar30 * auVar33._0_4_;
      auVar74._4_4_ = fVar65 * auVar33._4_4_;
      auVar74._8_4_ = fVar66 * auVar33._8_4_;
      auVar74._12_4_ = fVar90 * auVar33._12_4_;
      auVar33 = vminps_avx(auVar34,auVar74);
      auVar34 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar18 ^ 0x10)),
                                auVar99._0_16_);
      auVar75._0_4_ = fVar61 * auVar34._0_4_;
      auVar75._4_4_ = fVar91 * auVar34._4_4_;
      auVar75._8_4_ = fVar92 * auVar34._8_4_;
      auVar75._12_4_ = fVar93 * auVar34._12_4_;
      auVar32 = vmaxps_avx(auVar32,auVar95._0_16_);
      auVar31 = vmaxps_avx(auVar31,auVar32);
      auVar32 = vminps_avx(auVar75,auVar96._0_16_);
      auVar32 = vminps_avx(auVar33,auVar32);
      uVar21 = vcmpps_avx512vl(auVar31,auVar32,2);
      puVar15 = local_bc8;
      if ((char)uVar21 == '\0') goto LAB_01cf818a;
      uVar16 = uVar28 & 0xfffffffffffffff0;
      lVar17 = 0;
      for (uVar28 = uVar21; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      uVar28 = *(ulong *)(uVar16 + lVar17 * 8);
      uVar20 = (uint)uVar21 - 1 & (uint)uVar21;
      uVar21 = (ulong)uVar20;
      if (uVar20 != 0) {
        do {
          *local_bc8 = uVar28;
          local_bc8 = local_bc8 + 1;
          lVar17 = 0;
          for (uVar28 = uVar21; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar21 = uVar21 - 1 & uVar21;
          uVar28 = *(ulong *)(uVar16 + lVar17 * 8);
        } while (uVar21 != 0);
      }
    }
    local_b58 = (ulong)((uint)uVar28 & 0xf) - 8;
    uVar28 = uVar28 & 0xfffffffffffffff0;
    for (local_b50 = 0; puVar15 = local_bc8, local_b50 != local_b58; local_b50 = local_b50 + 1) {
      lVar17 = local_b50 * 0x58;
      local_b38 = uVar28 + lVar17;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(uVar28 + 0x20 + lVar17);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(uVar28 + 0x24 + lVar17);
      uVar9 = vpcmpub_avx512vl(auVar31,auVar32,2);
      uVar2 = *(undefined4 *)(uVar28 + 0x38 + lVar17);
      auVar33._4_4_ = uVar2;
      auVar33._0_4_ = uVar2;
      auVar33._8_4_ = uVar2;
      auVar33._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar28 + 0x44 + lVar17);
      auVar69._4_4_ = uVar2;
      auVar69._0_4_ = uVar2;
      auVar69._8_4_ = uVar2;
      auVar69._12_4_ = uVar2;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(local_b00 + 0x20 + local_b38);
      auVar31 = vpmovzxbd_avx(auVar72);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar32 = vfmadd213ps_fma(auVar31,auVar69,auVar33);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)(local_b08 + 0x20 + local_b38);
      auVar31 = vpmovzxbd_avx(auVar76);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar33 = vfmadd213ps_fma(auVar31,auVar69,auVar33);
      uVar2 = *(undefined4 *)(uVar28 + 0x3c + lVar17);
      auVar67._4_4_ = uVar2;
      auVar67._0_4_ = uVar2;
      auVar67._8_4_ = uVar2;
      auVar67._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar28 + 0x48 + lVar17);
      auVar70._4_4_ = uVar2;
      auVar70._0_4_ = uVar2;
      auVar70._8_4_ = uVar2;
      auVar70._12_4_ = uVar2;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = *(ulong *)(local_b10 + 0x20 + local_b38);
      auVar31 = vpmovzxbd_avx(auVar79);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar34 = vfmadd213ps_fma(auVar31,auVar70,auVar67);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(local_b18 + 0x20 + local_b38);
      auVar31 = vpmovzxbd_avx(auVar82);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar74 = vfmadd213ps_fma(auVar31,auVar70,auVar67);
      uVar2 = *(undefined4 *)(uVar28 + 0x40 + lVar17);
      auVar68._4_4_ = uVar2;
      auVar68._0_4_ = uVar2;
      auVar68._8_4_ = uVar2;
      auVar68._12_4_ = uVar2;
      uVar2 = *(undefined4 *)(uVar28 + 0x4c + lVar17);
      auVar71._4_4_ = uVar2;
      auVar71._0_4_ = uVar2;
      auVar71._8_4_ = uVar2;
      auVar71._12_4_ = uVar2;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = *(ulong *)(local_b20 + 0x20 + local_b38);
      auVar31 = vpmovzxbd_avx(auVar83);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar75 = vfmadd213ps_fma(auVar31,auVar71,auVar68);
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)(local_b28 + 0x20 + local_b38);
      auVar31 = vpmovzxbd_avx(auVar85);
      auVar31 = vcvtdq2ps_avx(auVar31);
      auVar67 = vfmadd213ps_fma(auVar31,auVar71,auVar68);
      auVar31 = vsubps_avx512vl(auVar32,auVar97._0_16_);
      auVar31 = vmulps_avx512vl(auVar100._0_16_,auVar31);
      auVar32 = vsubps_avx512vl(auVar34,auVar98._0_16_);
      auVar32 = vmulps_avx512vl(auVar101._0_16_,auVar32);
      auVar31 = vmaxps_avx(auVar31,auVar32);
      auVar32 = vsubps_avx512vl(auVar75,auVar99._0_16_);
      auVar32 = vmulps_avx512vl(auVar102._0_16_,auVar32);
      auVar33 = vsubps_avx512vl(auVar33,auVar97._0_16_);
      auVar73._0_4_ = fVar87 * auVar33._0_4_;
      auVar73._4_4_ = fVar62 * auVar33._4_4_;
      auVar73._8_4_ = fVar63 * auVar33._8_4_;
      auVar73._12_4_ = fVar64 * auVar33._12_4_;
      auVar33 = vsubps_avx512vl(auVar74,auVar98._0_16_);
      auVar77._0_4_ = fVar30 * auVar33._0_4_;
      auVar77._4_4_ = fVar65 * auVar33._4_4_;
      auVar77._8_4_ = fVar66 * auVar33._8_4_;
      auVar77._12_4_ = fVar90 * auVar33._12_4_;
      auVar33 = vminps_avx(auVar73,auVar77);
      auVar34 = vsubps_avx512vl(auVar67,auVar99._0_16_);
      auVar78._0_4_ = fVar61 * auVar34._0_4_;
      auVar78._4_4_ = fVar91 * auVar34._4_4_;
      auVar78._8_4_ = fVar92 * auVar34._8_4_;
      auVar78._12_4_ = fVar93 * auVar34._12_4_;
      auVar32 = vmaxps_avx(auVar32,auVar95._0_16_);
      auVar31 = vmaxps_avx(auVar31,auVar32);
      auVar32 = vminps_avx(auVar78,auVar96._0_16_);
      auVar32 = vminps_avx(auVar33,auVar32);
      uVar8 = vcmpps_avx512vl(auVar31,auVar32,2);
      for (local_af8 = CONCAT44((int)(local_b28 >> 0x20),(uint)(byte)((byte)uVar9 & (byte)uVar8));
          local_af8 != 0; local_af8 = local_af8 - 1 & local_af8) {
        lVar17 = 0;
        for (uVar24 = local_af8; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          lVar17 = lVar17 + 1;
        }
        uVar3 = *(ushort *)(local_b38 + lVar17 * 8);
        uVar4 = *(ushort *)(local_b38 + 2 + lVar17 * 8);
        pGVar23 = (context->scene->geometries).items[*(uint *)(local_b38 + 0x50)].ptr;
        lVar5 = *(long *)&pGVar23->field_0x58;
        lVar26 = pGVar23[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                 (ulong)*(uint *)(local_b38 + 4 + lVar17 * 8);
        local_b94 = uVar4 & 0x7fff;
        uVar20 = *(uint *)(lVar5 + 4 + lVar26);
        uVar21 = (ulong)uVar20;
        uVar25 = (ulong)(uVar20 * local_b94 + *(int *)(lVar5 + lVar26) + (uVar3 & 0x7fff));
        lVar17 = *(long *)&pGVar23[1].time_range.upper;
        p_Var6 = pGVar23[1].intersectionFilterN;
        auVar31 = *(undefined1 (*) [16])(lVar17 + (uVar25 + 1) * (long)p_Var6);
        auVar32 = *(undefined1 (*) [16])(lVar17 + (uVar25 + uVar21) * (long)p_Var6);
        lVar19 = uVar25 + uVar21 + 1;
        auVar33 = *(undefined1 (*) [16])(lVar17 + lVar19 * (long)p_Var6);
        uVar24 = (ulong)(-1 < (short)uVar3);
        auVar34 = *(undefined1 (*) [16])(lVar17 + (uVar25 + uVar24 + 1) * (long)p_Var6);
        lVar22 = uVar24 + lVar19;
        auVar74 = *(undefined1 (*) [16])(lVar17 + lVar22 * (long)p_Var6);
        uVar24 = 0;
        if (-1 < (short)uVar4) {
          uVar24 = uVar21;
        }
        auVar75 = *(undefined1 (*) [16])(lVar17 + (uVar25 + uVar21 + uVar24) * (long)p_Var6);
        auVar67 = *(undefined1 (*) [16])(lVar17 + (lVar19 + uVar24) * (long)p_Var6);
        auVar45._16_16_ = *(undefined1 (*) [16])(lVar17 + (uVar24 + lVar22) * (long)p_Var6);
        auVar45._0_16_ = auVar33;
        auVar69 = vunpcklps_avx(auVar31,auVar74);
        auVar68 = vunpckhps_avx(auVar31,auVar74);
        auVar70 = vunpcklps_avx(auVar34,auVar33);
        auVar34 = vunpckhps_avx(auVar34,auVar33);
        auVar71 = vunpcklps_avx(auVar68,auVar34);
        auVar72 = vunpcklps_avx(auVar69,auVar70);
        auVar34 = vunpckhps_avx(auVar69,auVar70);
        auVar69 = vunpcklps_avx(auVar32,auVar67);
        auVar68 = vunpckhps_avx(auVar32,auVar67);
        auVar70 = vunpcklps_avx(auVar33,auVar75);
        auVar75 = vunpckhps_avx(auVar33,auVar75);
        auVar68 = vunpcklps_avx(auVar68,auVar75);
        auVar73 = vunpcklps_avx(auVar69,auVar70);
        auVar75 = vunpckhps_avx(auVar69,auVar70);
        auVar42._16_16_ = auVar67;
        auVar42._0_16_ = auVar32;
        auVar40._16_16_ = auVar74;
        auVar40._0_16_ = auVar31;
        auVar60 = vunpcklps_avx(auVar40,auVar42);
        auVar37._16_16_ = auVar33;
        auVar37._0_16_ = *(undefined1 (*) [16])(lVar17 + (long)p_Var6 * uVar25);
        auVar59 = vunpcklps_avx(auVar37,auVar45);
        auVar56 = vunpcklps_avx(auVar59,auVar60);
        auVar59 = vunpckhps_avx(auVar59,auVar60);
        auVar60 = vunpckhps_avx(auVar40,auVar42);
        auVar55 = vunpckhps_avx(auVar37,auVar45);
        auVar55 = vunpcklps_avx(auVar55,auVar60);
        auVar41._16_16_ = auVar72;
        auVar41._0_16_ = auVar72;
        auVar43._16_16_ = auVar34;
        auVar43._0_16_ = auVar34;
        auVar44._16_16_ = auVar71;
        auVar44._0_16_ = auVar71;
        auVar46._16_16_ = auVar73;
        auVar46._0_16_ = auVar73;
        auVar48._16_16_ = auVar75;
        auVar48._0_16_ = auVar75;
        uVar2 = *(undefined4 *)(local_bb8 + local_bc0 * 4);
        auVar49._4_4_ = uVar2;
        auVar49._0_4_ = uVar2;
        auVar49._8_4_ = uVar2;
        auVar49._12_4_ = uVar2;
        auVar49._16_4_ = uVar2;
        auVar49._20_4_ = uVar2;
        auVar49._24_4_ = uVar2;
        auVar49._28_4_ = uVar2;
        uVar2 = *(undefined4 *)(local_bb8 + local_bc0 * 4 + 0x10);
        auVar50._4_4_ = uVar2;
        auVar50._0_4_ = uVar2;
        auVar50._8_4_ = uVar2;
        auVar50._12_4_ = uVar2;
        auVar50._16_4_ = uVar2;
        auVar50._20_4_ = uVar2;
        auVar50._24_4_ = uVar2;
        auVar50._28_4_ = uVar2;
        auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_bb8 + local_bc0 * 4 + 0x20)));
        uVar2 = *(undefined4 *)(local_bb8 + local_bc0 * 4 + 0x40);
        auVar84._4_4_ = uVar2;
        auVar84._0_4_ = uVar2;
        auVar84._8_4_ = uVar2;
        auVar84._12_4_ = uVar2;
        auVar84._16_4_ = uVar2;
        auVar84._20_4_ = uVar2;
        auVar84._24_4_ = uVar2;
        auVar84._28_4_ = uVar2;
        auVar47._16_16_ = auVar68;
        auVar47._0_16_ = auVar68;
        uVar2 = *(undefined4 *)(local_bb8 + local_bc0 * 4 + 0x50);
        auVar88._4_4_ = uVar2;
        auVar88._0_4_ = uVar2;
        auVar88._8_4_ = uVar2;
        auVar88._12_4_ = uVar2;
        auVar88._16_4_ = uVar2;
        auVar88._20_4_ = uVar2;
        auVar88._24_4_ = uVar2;
        auVar88._28_4_ = uVar2;
        fVar87 = *(float *)(local_bb8 + local_bc0 * 4 + 0x60);
        auVar94._4_4_ = fVar87;
        auVar94._0_4_ = fVar87;
        auVar94._8_4_ = fVar87;
        auVar94._12_4_ = fVar87;
        auVar94._16_4_ = fVar87;
        auVar94._20_4_ = fVar87;
        auVar94._24_4_ = fVar87;
        auVar94._28_4_ = fVar87;
        auVar60 = vsubps_avx(auVar56,auVar49);
        auVar59 = vsubps_avx(auVar59,auVar50);
        auVar37 = vsubps_avx512vl(auVar55,auVar36);
        auVar55 = vsubps_avx(auVar41,auVar49);
        auVar56 = vsubps_avx(auVar43,auVar50);
        auVar38 = vsubps_avx512vl(auVar44,auVar36);
        auVar39 = vsubps_avx512vl(auVar46,auVar49);
        auVar40 = vsubps_avx512vl(auVar48,auVar50);
        auVar41 = vsubps_avx512vl(auVar47,auVar36);
        auVar42 = vsubps_avx512vl(auVar39,auVar60);
        auVar43 = vsubps_avx512vl(auVar40,auVar59);
        auVar44 = vsubps_avx512vl(auVar41,auVar37);
        auVar45 = vsubps_avx512vl(auVar60,auVar55);
        auVar46 = vsubps_avx512vl(auVar59,auVar56);
        auVar47 = vsubps_avx512vl(auVar37,auVar38);
        auVar48 = vsubps_avx512vl(auVar55,auVar39);
        auVar49 = vsubps_avx512vl(auVar56,auVar40);
        auVar50 = vsubps_avx512vl(auVar38,auVar41);
        auVar51 = vaddps_avx512vl(auVar39,auVar60);
        auVar52 = vaddps_avx512vl(auVar40,auVar59);
        auVar36 = vaddps_avx512vl(auVar41,auVar37);
        auVar53 = vmulps_avx512vl(auVar52,auVar44);
        auVar53 = vfmsub231ps_avx512vl(auVar53,auVar43,auVar36);
        auVar36 = vmulps_avx512vl(auVar36,auVar42);
        auVar54 = vfmsub231ps_avx512vl(auVar36,auVar44,auVar51);
        auVar36._4_4_ = auVar51._4_4_ * auVar43._4_4_;
        auVar36._0_4_ = auVar51._0_4_ * auVar43._0_4_;
        auVar36._8_4_ = auVar51._8_4_ * auVar43._8_4_;
        auVar36._12_4_ = auVar51._12_4_ * auVar43._12_4_;
        auVar36._16_4_ = auVar51._16_4_ * auVar43._16_4_;
        auVar36._20_4_ = auVar51._20_4_ * auVar43._20_4_;
        auVar36._24_4_ = auVar51._24_4_ * auVar43._24_4_;
        auVar36._28_4_ = auVar51._28_4_;
        auVar31 = vfmsub231ps_fma(auVar36,auVar42,auVar52);
        auVar52._0_4_ = auVar31._0_4_ * fVar87;
        auVar52._4_4_ = auVar31._4_4_ * fVar87;
        auVar52._8_4_ = auVar31._8_4_ * fVar87;
        auVar52._12_4_ = auVar31._12_4_ * fVar87;
        auVar52._16_4_ = fVar87 * 0.0;
        auVar52._20_4_ = fVar87 * 0.0;
        auVar52._24_4_ = fVar87 * 0.0;
        auVar52._28_4_ = 0;
        auVar36 = vfmadd231ps_avx512vl(auVar52,auVar88,auVar54);
        auVar36 = vfmadd231ps_avx512vl(auVar36,auVar84,auVar53);
        auVar54._0_4_ = auVar60._0_4_ + auVar55._0_4_;
        auVar54._4_4_ = auVar60._4_4_ + auVar55._4_4_;
        auVar54._8_4_ = auVar60._8_4_ + auVar55._8_4_;
        auVar54._12_4_ = auVar60._12_4_ + auVar55._12_4_;
        auVar54._16_4_ = auVar60._16_4_ + auVar55._16_4_;
        auVar54._20_4_ = auVar60._20_4_ + auVar55._20_4_;
        auVar54._24_4_ = auVar60._24_4_ + auVar55._24_4_;
        auVar54._28_4_ = auVar60._28_4_ + auVar55._28_4_;
        auVar51 = vaddps_avx512vl(auVar59,auVar56);
        auVar52 = vaddps_avx512vl(auVar37,auVar38);
        auVar53 = vmulps_avx512vl(auVar51,auVar47);
        auVar53 = vfmsub231ps_avx512vl(auVar53,auVar46,auVar52);
        auVar52 = vmulps_avx512vl(auVar52,auVar45);
        auVar52 = vfmsub231ps_avx512vl(auVar52,auVar47,auVar54);
        auVar54 = vmulps_avx512vl(auVar54,auVar46);
        auVar54 = vfmsub231ps_avx512vl(auVar54,auVar45,auVar51);
        auVar51._4_4_ = auVar54._4_4_ * fVar87;
        auVar51._0_4_ = auVar54._0_4_ * fVar87;
        auVar51._8_4_ = auVar54._8_4_ * fVar87;
        auVar51._12_4_ = auVar54._12_4_ * fVar87;
        auVar51._16_4_ = auVar54._16_4_ * fVar87;
        auVar51._20_4_ = auVar54._20_4_ * fVar87;
        auVar51._24_4_ = auVar54._24_4_ * fVar87;
        auVar51._28_4_ = auVar54._28_4_;
        auVar51 = vfmadd231ps_avx512vl(auVar51,auVar88,auVar52);
        auVar51 = vfmadd231ps_avx512vl(auVar51,auVar84,auVar53);
        auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar55 = vaddps_avx512vl(auVar55,auVar39);
        auVar56 = vaddps_avx512vl(auVar56,auVar40);
        auVar38 = vaddps_avx512vl(auVar38,auVar41);
        auVar39 = vmulps_avx512vl(auVar56,auVar50);
        auVar39 = vfmsub231ps_avx512vl(auVar39,auVar49,auVar38);
        auVar38 = vmulps_avx512vl(auVar38,auVar48);
        auVar40 = vfmsub231ps_avx512vl(auVar38,auVar50,auVar55);
        auVar38._4_4_ = auVar55._4_4_ * auVar49._4_4_;
        auVar38._0_4_ = auVar55._0_4_ * auVar49._0_4_;
        auVar38._8_4_ = auVar55._8_4_ * auVar49._8_4_;
        auVar38._12_4_ = auVar55._12_4_ * auVar49._12_4_;
        auVar38._16_4_ = auVar55._16_4_ * auVar49._16_4_;
        auVar38._20_4_ = auVar55._20_4_ * auVar49._20_4_;
        auVar38._24_4_ = auVar55._24_4_ * auVar49._24_4_;
        auVar38._28_4_ = auVar55._28_4_;
        auVar31 = vfmsub231ps_fma(auVar38,auVar48,auVar56);
        auVar55 = vmulps_avx512vl(ZEXT1632(auVar31),auVar94);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar88,auVar40);
        auVar38 = vfmadd231ps_avx512vl(auVar55,auVar84,auVar39);
        auVar39._0_4_ = auVar36._0_4_ + auVar51._0_4_;
        auVar39._4_4_ = auVar36._4_4_ + auVar51._4_4_;
        auVar39._8_4_ = auVar36._8_4_ + auVar51._8_4_;
        auVar39._12_4_ = auVar36._12_4_ + auVar51._12_4_;
        auVar39._16_4_ = auVar36._16_4_ + auVar51._16_4_;
        auVar39._20_4_ = auVar36._20_4_ + auVar51._20_4_;
        auVar39._24_4_ = auVar36._24_4_ + auVar51._24_4_;
        auVar39._28_4_ = auVar36._28_4_ + auVar51._28_4_;
        local_900 = vaddps_avx512vl(auVar38,auVar39);
        vandps_avx512vl(local_900,auVar52);
        auVar55._8_4_ = 0x34000000;
        auVar55._0_8_ = 0x3400000034000000;
        auVar55._12_4_ = 0x34000000;
        auVar55._16_4_ = 0x34000000;
        auVar55._20_4_ = 0x34000000;
        auVar55._24_4_ = 0x34000000;
        auVar55._28_4_ = 0x34000000;
        auVar55 = vmulps_avx512vl(local_900,auVar55);
        auVar56 = vminps_avx512vl(auVar36,auVar51);
        auVar39 = vminps_avx512vl(auVar56,auVar38);
        auVar56._8_4_ = 0x80000000;
        auVar56._0_8_ = 0x8000000080000000;
        auVar56._12_4_ = 0x80000000;
        auVar56._16_4_ = 0x80000000;
        auVar56._20_4_ = 0x80000000;
        auVar56._24_4_ = 0x80000000;
        auVar56._28_4_ = 0x80000000;
        auVar56 = vxorps_avx512vl(auVar55,auVar56);
        uVar8 = vcmpps_avx512vl(auVar39,auVar56,5);
        auVar56 = vmaxps_avx512vl(auVar36,auVar51);
        auVar56 = vmaxps_avx512vl(auVar56,auVar38);
        uVar9 = vcmpps_avx512vl(auVar56,auVar55,2);
        bVar10 = (byte)uVar8 | (byte)uVar9;
        if (bVar10 != 0) {
          auVar55 = vmulps_avx512vl(auVar46,auVar44);
          auVar56 = vmulps_avx512vl(auVar42,auVar47);
          auVar38 = vmulps_avx512vl(auVar45,auVar43);
          auVar39 = vmulps_avx512vl(auVar49,auVar47);
          auVar40 = vmulps_avx512vl(auVar45,auVar50);
          auVar41 = vmulps_avx512vl(auVar48,auVar46);
          auVar43 = vfmsub213ps_avx512vl(auVar43,auVar47,auVar55);
          auVar44 = vfmsub213ps_avx512vl(auVar44,auVar45,auVar56);
          auVar42 = vfmsub213ps_avx512vl(auVar42,auVar46,auVar38);
          auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar39);
          auVar47 = vfmsub213ps_avx512vl(auVar48,auVar47,auVar40);
          auVar45 = vfmsub213ps_avx512vl(auVar49,auVar45,auVar41);
          vandps_avx512vl(auVar55,auVar52);
          vandps_avx512vl(auVar39,auVar52);
          uVar24 = vcmpps_avx512vl(auVar45,auVar45,1);
          vandps_avx512vl(auVar56,auVar52);
          vandps_avx512vl(auVar40,auVar52);
          uVar25 = vcmpps_avx512vl(auVar45,auVar45,1);
          vandps_avx512vl(auVar38,auVar52);
          vandps_avx512vl(auVar41,auVar52);
          uVar21 = vcmpps_avx512vl(auVar45,auVar45,1);
          bVar7 = (bool)((byte)uVar24 & 1);
          auVar57._0_4_ = (float)((uint)bVar7 * auVar43._0_4_ | (uint)!bVar7 * auVar46._0_4_);
          bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
          auVar57._4_4_ = (float)((uint)bVar7 * auVar43._4_4_ | (uint)!bVar7 * auVar46._4_4_);
          bVar7 = (bool)((byte)(uVar24 >> 2) & 1);
          auVar57._8_4_ = (float)((uint)bVar7 * auVar43._8_4_ | (uint)!bVar7 * auVar46._8_4_);
          bVar7 = (bool)((byte)(uVar24 >> 3) & 1);
          auVar57._12_4_ = (float)((uint)bVar7 * auVar43._12_4_ | (uint)!bVar7 * auVar46._12_4_);
          bVar7 = (bool)((byte)(uVar24 >> 4) & 1);
          auVar57._16_4_ = (float)((uint)bVar7 * auVar43._16_4_ | (uint)!bVar7 * auVar46._16_4_);
          bVar7 = (bool)((byte)(uVar24 >> 5) & 1);
          auVar57._20_4_ = (float)((uint)bVar7 * auVar43._20_4_ | (uint)!bVar7 * auVar46._20_4_);
          bVar7 = (bool)((byte)(uVar24 >> 6) & 1);
          auVar57._24_4_ = (float)((uint)bVar7 * auVar43._24_4_ | (uint)!bVar7 * auVar46._24_4_);
          bVar7 = SUB81(uVar24 >> 7,0);
          auVar57._28_4_ = (uint)bVar7 * auVar43._28_4_ | (uint)!bVar7 * auVar46._28_4_;
          bVar7 = (bool)((byte)uVar25 & 1);
          auVar58._0_4_ = (float)((uint)bVar7 * auVar44._0_4_ | (uint)!bVar7 * auVar47._0_4_);
          bVar7 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar58._4_4_ = (float)((uint)bVar7 * auVar44._4_4_ | (uint)!bVar7 * auVar47._4_4_);
          bVar7 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar58._8_4_ = (float)((uint)bVar7 * auVar44._8_4_ | (uint)!bVar7 * auVar47._8_4_);
          bVar7 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar58._12_4_ = (float)((uint)bVar7 * auVar44._12_4_ | (uint)!bVar7 * auVar47._12_4_);
          bVar7 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar58._16_4_ = (float)((uint)bVar7 * auVar44._16_4_ | (uint)!bVar7 * auVar47._16_4_);
          bVar7 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar58._20_4_ = (float)((uint)bVar7 * auVar44._20_4_ | (uint)!bVar7 * auVar47._20_4_);
          bVar7 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar58._24_4_ = (float)((uint)bVar7 * auVar44._24_4_ | (uint)!bVar7 * auVar47._24_4_);
          bVar7 = SUB81(uVar25 >> 7,0);
          auVar58._28_4_ = (uint)bVar7 * auVar44._28_4_ | (uint)!bVar7 * auVar47._28_4_;
          bVar7 = (bool)((byte)uVar21 & 1);
          fVar30 = (float)((uint)bVar7 * auVar42._0_4_ | (uint)!bVar7 * auVar45._0_4_);
          bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
          fVar61 = (float)((uint)bVar7 * auVar42._4_4_ | (uint)!bVar7 * auVar45._4_4_);
          bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
          fVar62 = (float)((uint)bVar7 * auVar42._8_4_ | (uint)!bVar7 * auVar45._8_4_);
          bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
          fVar63 = (float)((uint)bVar7 * auVar42._12_4_ | (uint)!bVar7 * auVar45._12_4_);
          bVar7 = (bool)((byte)(uVar21 >> 4) & 1);
          fVar64 = (float)((uint)bVar7 * auVar42._16_4_ | (uint)!bVar7 * auVar45._16_4_);
          bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
          fVar65 = (float)((uint)bVar7 * auVar42._20_4_ | (uint)!bVar7 * auVar45._20_4_);
          bVar7 = (bool)((byte)(uVar21 >> 6) & 1);
          fVar66 = (float)((uint)bVar7 * auVar42._24_4_ | (uint)!bVar7 * auVar45._24_4_);
          bVar7 = SUB81(uVar21 >> 7,0);
          auVar53._4_4_ = fVar87 * fVar61;
          auVar53._0_4_ = fVar87 * fVar30;
          auVar53._8_4_ = fVar87 * fVar62;
          auVar53._12_4_ = fVar87 * fVar63;
          auVar53._16_4_ = fVar87 * fVar64;
          auVar53._20_4_ = fVar87 * fVar65;
          auVar53._24_4_ = fVar87 * fVar66;
          auVar53._28_4_ = fVar87;
          auVar31 = vfmadd213ps_fma(auVar88,auVar58,auVar53);
          auVar31 = vfmadd213ps_fma(auVar84,auVar57,ZEXT1632(auVar31));
          auVar55 = ZEXT1632(CONCAT412(auVar31._12_4_ + auVar31._12_4_,
                                       CONCAT48(auVar31._8_4_ + auVar31._8_4_,
                                                CONCAT44(auVar31._4_4_ + auVar31._4_4_,
                                                         auVar31._0_4_ + auVar31._0_4_))));
          auVar89._0_4_ = auVar37._0_4_ * fVar30;
          auVar89._4_4_ = auVar37._4_4_ * fVar61;
          auVar89._8_4_ = auVar37._8_4_ * fVar62;
          auVar89._12_4_ = auVar37._12_4_ * fVar63;
          auVar89._16_4_ = auVar37._16_4_ * fVar64;
          auVar89._20_4_ = auVar37._20_4_ * fVar65;
          auVar89._24_4_ = auVar37._24_4_ * fVar66;
          auVar89._28_4_ = 0;
          auVar31 = vfmadd213ps_fma(auVar59,auVar58,auVar89);
          auVar32 = vfmadd213ps_fma(auVar60,auVar57,ZEXT1632(auVar31));
          auVar59 = vrcp14ps_avx512vl(auVar55);
          auVar60._8_4_ = 0x3f800000;
          auVar60._0_8_ = 0x3f8000003f800000;
          auVar60._12_4_ = 0x3f800000;
          auVar60._16_4_ = 0x3f800000;
          auVar60._20_4_ = 0x3f800000;
          auVar60._24_4_ = 0x3f800000;
          auVar60._28_4_ = 0x3f800000;
          auVar60 = vfnmadd213ps_avx512vl(auVar59,auVar55,auVar60);
          auVar31 = vfmadd132ps_fma(auVar60,auVar59,auVar59);
          uVar2 = *(undefined4 *)(local_bb8 + local_bc0 * 4 + 0x80);
          local_a60._4_4_ = uVar2;
          local_a60._0_4_ = uVar2;
          local_a60._8_4_ = uVar2;
          local_a60._12_4_ = uVar2;
          local_a60._16_4_ = uVar2;
          local_a60._20_4_ = uVar2;
          local_a60._24_4_ = uVar2;
          local_a60._28_4_ = uVar2;
          auVar95 = ZEXT3264(local_a60);
          local_880 = ZEXT1632(CONCAT412(auVar31._12_4_ * (auVar32._12_4_ + auVar32._12_4_),
                                         CONCAT48(auVar31._8_4_ * (auVar32._8_4_ + auVar32._8_4_),
                                                  CONCAT44(auVar31._4_4_ *
                                                           (auVar32._4_4_ + auVar32._4_4_),
                                                           auVar31._0_4_ *
                                                           (auVar32._0_4_ + auVar32._0_4_)))));
          uVar8 = vcmpps_avx512vl(local_880,local_a60,2);
          uVar2 = *(undefined4 *)(local_bb8 + local_bc0 * 4 + 0x30);
          auVar59._4_4_ = uVar2;
          auVar59._0_4_ = uVar2;
          auVar59._8_4_ = uVar2;
          auVar59._12_4_ = uVar2;
          auVar59._16_4_ = uVar2;
          auVar59._20_4_ = uVar2;
          auVar59._24_4_ = uVar2;
          auVar59._28_4_ = uVar2;
          uVar9 = vcmpps_avx512vl(local_880,auVar59,0xd);
          bVar10 = (byte)uVar8 & (byte)uVar9 & bVar10;
          if (bVar10 != 0) {
            local_bb0 = vcmpps_avx512vl(auVar55,_DAT_01f7b000,4);
            local_bb0 = bVar10 & local_bb0;
            local_8d8 = (char)local_bb0;
            if (local_8d8 != '\0') {
              local_8e0 = &local_bc9;
              auVar60 = vsubps_avx(local_900,auVar51);
              local_940 = vblendps_avx(auVar36,auVar60,0xf0);
              auVar60 = vsubps_avx(local_900,auVar36);
              local_920 = vblendps_avx(auVar51,auVar60,0xf0);
              local_860[0] = auVar57._0_4_ * 1.0;
              local_860[1] = auVar57._4_4_ * 1.0;
              local_860[2] = auVar57._8_4_ * 1.0;
              local_860[3] = auVar57._12_4_ * 1.0;
              fStack_850 = auVar57._16_4_ * -1.0;
              fStack_84c = auVar57._20_4_ * -1.0;
              fStack_848 = auVar57._24_4_ * -1.0;
              uStack_844 = auVar57._28_4_;
              local_840._4_4_ = auVar58._4_4_ * 1.0;
              local_840._0_4_ = auVar58._0_4_ * 1.0;
              local_840._8_4_ = auVar58._8_4_ * 1.0;
              local_840._12_4_ = auVar58._12_4_ * 1.0;
              local_840._16_4_ = auVar58._16_4_ * -1.0;
              local_840._20_4_ = auVar58._20_4_ * -1.0;
              local_840._24_4_ = auVar58._24_4_ * -1.0;
              local_840._28_4_ = auVar58._28_4_;
              local_820._4_4_ = fVar61 * 1.0;
              local_820._0_4_ = fVar30 * 1.0;
              local_820._8_4_ = fVar62 * 1.0;
              local_820._12_4_ = fVar63 * 1.0;
              local_820._16_4_ = fVar64 * -1.0;
              local_820._20_4_ = fVar65 * -1.0;
              local_820._24_4_ = fVar66 * -1.0;
              local_820._28_4_ = (uint)bVar7 * auVar42._28_4_ | (uint)!bVar7 * auVar45._28_4_;
              pGVar23 = (context->scene->geometries).items[*(uint *)(local_b38 + 0x50)].ptr;
              if ((pGVar23->mask & *(uint *)(local_bb8 + local_bc0 * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar23->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01cf8df5:
                  *(undefined4 *)(local_bb8 + local_bc0 * 4 + 0x80) = 0xff800000;
                  goto LAB_01cf8e1a;
                }
                auVar60 = vpbroadcastd_avx512vl();
                auVar60 = vpaddd_avx2(auVar60,_DAT_01fb7740);
                auVar59 = vpbroadcastd_avx512vl();
                auVar59 = vpaddd_avx2(auVar59,_DAT_01fb7760);
                auVar80._0_4_ = (float)(int)(*(ushort *)(lVar5 + 8 + lVar26) - 1);
                auVar80._4_12_ = auVar36._4_12_;
                auVar14._12_4_ = 0;
                auVar14._0_12_ = ZEXT812(0);
                auVar32 = vrcp14ss_avx512f(auVar14 << 0x20,ZEXT416((uint)auVar80._0_4_));
                auVar31 = vfnmadd213ss_fma(auVar80,auVar32,SUB6416(ZEXT464(0x40000000),0));
                fVar66 = auVar32._0_4_ * auVar31._0_4_;
                auVar86._0_4_ = (float)(int)(*(ushort *)(lVar5 + 10 + lVar26) - 1);
                auVar86._4_12_ = auVar36._4_12_;
                auVar32 = vrcp14ss_avx512f(auVar14 << 0x20,ZEXT416((uint)auVar86._0_4_));
                auVar31 = vfnmadd213ss_fma(auVar86,auVar32,SUB6416(ZEXT464(0x40000000),0));
                fVar90 = auVar32._0_4_ * auVar31._0_4_;
                auVar60 = vcvtdq2ps_avx(auVar60);
                auVar59 = vcvtdq2ps_avx(auVar59);
                auVar11._8_4_ = 0x219392ef;
                auVar11._0_8_ = 0x219392ef219392ef;
                auVar11._12_4_ = 0x219392ef;
                auVar11._16_4_ = 0x219392ef;
                auVar11._20_4_ = 0x219392ef;
                auVar11._24_4_ = 0x219392ef;
                auVar11._28_4_ = 0x219392ef;
                uVar24 = vcmpps_avx512vl(local_900,auVar11,5);
                auVar55 = vrcp14ps_avx512vl(local_900);
                auVar81._8_4_ = 0x3f800000;
                auVar81._0_8_ = 0x3f8000003f800000;
                auVar81._12_4_ = 0x3f800000;
                auVar81._16_4_ = 0x3f800000;
                auVar81._20_4_ = 0x3f800000;
                auVar81._24_4_ = 0x3f800000;
                auVar81._28_4_ = 0x3f800000;
                auVar31 = vfnmadd213ps_fma(local_900,auVar55,auVar81);
                auVar56 = vfmadd132ps_avx512vl(ZEXT1632(auVar31),auVar55,auVar55);
                fVar65 = (float)((uint)((byte)uVar24 & 1) * auVar56._0_4_);
                fVar64 = (float)((uint)((byte)(uVar24 >> 1) & 1) * auVar56._4_4_);
                fVar63 = (float)((uint)((byte)(uVar24 >> 2) & 1) * auVar56._8_4_);
                fVar62 = (float)((uint)((byte)(uVar24 >> 3) & 1) * auVar56._12_4_);
                fVar61 = (float)((uint)((byte)(uVar24 >> 4) & 1) * auVar56._16_4_);
                fVar30 = (float)((uint)((byte)(uVar24 >> 5) & 1) * auVar56._20_4_);
                fVar87 = (float)((uint)((byte)(uVar24 >> 6) & 1) * auVar56._24_4_);
                auVar12._4_4_ =
                     (local_900._4_4_ * auVar60._4_4_ + local_940._4_4_) * fVar66 * fVar64;
                auVar12._0_4_ =
                     (local_900._0_4_ * auVar60._0_4_ + local_940._0_4_) * fVar66 * fVar65;
                auVar12._8_4_ =
                     (local_900._8_4_ * auVar60._8_4_ + local_940._8_4_) * fVar66 * fVar63;
                auVar12._12_4_ =
                     (local_900._12_4_ * auVar60._12_4_ + local_940._12_4_) * fVar66 * fVar62;
                auVar12._16_4_ =
                     (local_900._16_4_ * auVar60._16_4_ + local_940._16_4_) * fVar66 * fVar61;
                auVar12._20_4_ =
                     (local_900._20_4_ * auVar60._20_4_ + local_940._20_4_) * fVar66 * fVar30;
                auVar12._24_4_ =
                     (local_900._24_4_ * auVar60._24_4_ + local_940._24_4_) * fVar66 * fVar87;
                auVar12._28_4_ = auVar55._28_4_;
                local_8c0 = vminps_avx(auVar12,auVar81);
                auVar13._4_4_ =
                     (local_900._4_4_ * auVar59._4_4_ + local_920._4_4_) * fVar90 * fVar64;
                auVar13._0_4_ =
                     (local_900._0_4_ * auVar59._0_4_ + local_920._0_4_) * fVar90 * fVar65;
                auVar13._8_4_ =
                     (local_900._8_4_ * auVar59._8_4_ + local_920._8_4_) * fVar90 * fVar63;
                auVar13._12_4_ =
                     (local_900._12_4_ * auVar59._12_4_ + local_920._12_4_) * fVar90 * fVar62;
                auVar13._16_4_ =
                     (local_900._16_4_ * auVar59._16_4_ + local_920._16_4_) * fVar90 * fVar61;
                auVar13._20_4_ =
                     (local_900._20_4_ * auVar59._20_4_ + local_920._20_4_) * fVar90 * fVar30;
                auVar13._24_4_ =
                     (local_900._24_4_ * auVar59._24_4_ + local_920._24_4_) * fVar90 * fVar87;
                auVar13._28_4_ = (uint)(byte)(uVar24 >> 7) * auVar56._28_4_;
                local_8a0 = vminps_avx(auVar13,auVar81);
                local_ba0 = 0;
                for (uVar24 = local_bb0; (uVar24 & 1) == 0;
                    uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                  local_ba0 = local_ba0 + 1;
                }
                local_b80 = vpbroadcastd_avx512vl();
                local_b90 = vpbroadcastd_avx512vl();
                local_aa0 = auVar97._0_16_;
                local_ab0 = auVar98._0_16_;
                local_ac0 = auVar99._0_16_;
                local_ad0 = auVar100._0_16_;
                local_ae0 = auVar101._0_16_;
                local_af0 = auVar102._0_16_;
                local_ba8 = pGVar23;
                while (local_bb0 != 0) {
                  uVar2 = *(undefined4 *)(local_8c0 + local_ba0 * 4);
                  local_9a0._4_4_ = uVar2;
                  local_9a0._0_4_ = uVar2;
                  local_9a0._8_4_ = uVar2;
                  local_9a0._12_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_8a0 + local_ba0 * 4);
                  local_990._4_4_ = uVar2;
                  local_990._0_4_ = uVar2;
                  local_990._8_4_ = uVar2;
                  local_990._12_4_ = uVar2;
                  *(float *)(local_bb8 + local_bc0 * 4 + 0x80) = local_860[local_ba0 - 8];
                  local_a90.context = context->user;
                  local_9d0 = local_860[local_ba0];
                  uVar2 = *(undefined4 *)(local_840 + local_ba0 * 4);
                  local_9c0._4_4_ = uVar2;
                  local_9c0._0_4_ = uVar2;
                  local_9c0._8_4_ = uVar2;
                  local_9c0._12_4_ = uVar2;
                  local_9b0 = *(undefined4 *)(local_820 + local_ba0 * 4);
                  local_980 = local_b90._0_8_;
                  uStack_978 = local_b90._8_8_;
                  local_970 = local_b80;
                  vpcmpeqd_avx2(ZEXT1632(local_b80),ZEXT1632(local_b80));
                  uStack_95c = (local_a90.context)->instID[0];
                  local_960 = uStack_95c;
                  uStack_958 = uStack_95c;
                  uStack_954 = uStack_95c;
                  uStack_950 = (local_a90.context)->instPrimID[0];
                  uStack_94c = uStack_950;
                  uStack_948 = uStack_950;
                  uStack_944 = uStack_950;
                  local_b70 = local_a30;
                  local_a90.valid = (int *)local_b70;
                  local_a90.geometryUserPtr = pGVar23->userPtr;
                  local_a90.ray = (RTCRayN *)local_bb8;
                  local_a90.hit = (RTCHitN *)&local_9d0;
                  local_a90.N = 4;
                  fStack_9cc = local_9d0;
                  fStack_9c8 = local_9d0;
                  fStack_9c4 = local_9d0;
                  uStack_9ac = local_9b0;
                  uStack_9a8 = local_9b0;
                  uStack_9a4 = local_9b0;
                  if (pGVar23->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar23->occlusionFilterN)(&local_a90);
                    auVar95 = ZEXT3264(local_a60);
                    auVar102 = ZEXT1664(local_af0);
                    auVar101 = ZEXT1664(local_ae0);
                    auVar100 = ZEXT1664(local_ad0);
                    auVar99 = ZEXT1664(local_ac0);
                    auVar98 = ZEXT1664(local_ab0);
                    auVar97 = ZEXT1664(local_aa0);
                    pGVar23 = local_ba8;
                  }
                  uVar24 = vptestmd_avx512vl(local_b70,local_b70);
                  if ((uVar24 & 0xf) != 0) {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var6)(&local_a90);
                      auVar95 = ZEXT3264(local_a60);
                      auVar102 = ZEXT1664(local_af0);
                      auVar101 = ZEXT1664(local_ae0);
                      auVar100 = ZEXT1664(local_ad0);
                      auVar99 = ZEXT1664(local_ac0);
                      auVar98 = ZEXT1664(local_ab0);
                      auVar97 = ZEXT1664(local_aa0);
                      pGVar23 = local_ba8;
                    }
                    auVar31 = *(undefined1 (*) [16])(local_a90.ray + 0x80);
                    uVar24 = vptestmd_avx512vl(local_b70,local_b70);
                    uVar24 = uVar24 & 0xf;
                    auVar32 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar7 = (bool)((byte)uVar24 & 1);
                    auVar35._0_4_ = (uint)bVar7 * auVar32._0_4_ | (uint)!bVar7 * auVar31._0_4_;
                    bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
                    auVar35._4_4_ = (uint)bVar7 * auVar32._4_4_ | (uint)!bVar7 * auVar31._4_4_;
                    bVar7 = (bool)((byte)(uVar24 >> 2) & 1);
                    auVar35._8_4_ = (uint)bVar7 * auVar32._8_4_ | (uint)!bVar7 * auVar31._8_4_;
                    bVar7 = SUB81(uVar24 >> 3,0);
                    auVar35._12_4_ = (uint)bVar7 * auVar32._12_4_ | (uint)!bVar7 * auVar31._12_4_;
                    *(undefined1 (*) [16])(local_a90.ray + 0x80) = auVar35;
                    if ((byte)uVar24 != 0) goto LAB_01cf8df5;
                  }
                  *(int *)(local_bb8 + local_bc0 * 4 + 0x80) = auVar95._0_4_;
                  uVar24 = local_ba0 & 0x3f;
                  local_ba0 = 0;
                  local_bb0 = local_bb0 ^ 1L << uVar24;
                  for (uVar24 = local_bb0; (uVar24 & 1) == 0;
                      uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                    local_ba0 = local_ba0 + 1;
                  }
                }
              }
            }
          }
        }
        auVar95 = ZEXT1664(local_a10);
        auVar96 = ZEXT1664(local_a20);
        uVar24 = local_b40;
        uVar25 = local_b48;
        fVar87 = local_9e0;
        fVar62 = fStack_9dc;
        fVar63 = fStack_9d8;
        fVar64 = fStack_9d4;
        fVar30 = local_9f0;
        fVar65 = fStack_9ec;
        fVar66 = fStack_9e8;
        fVar90 = fStack_9e4;
        fVar61 = local_a00;
        fVar91 = fStack_9fc;
        fVar92 = fStack_9f8;
        fVar93 = fStack_9f4;
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }